

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall CoreTest_ConvertToInt_Test::TestBody(CoreTest_ConvertToInt_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined8 in_stack_fffffffffffffef8;
  AssertionResult *pAVar4;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  int line;
  undefined7 in_stack_ffffffffffffff20;
  string local_d8 [4];
  Type in_stack_ffffffffffffff2c;
  AssertHelper *in_stack_ffffffffffffff30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  AssertionResult *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_68;
  string local_58 [64];
  AssertionResult local_18;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  pAVar4 = &local_18;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (bool)uVar2);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  line = (int)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),line,
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_58);
    testing::Message::~Message((Message *)0x123297);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12330f);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (bool)uVar2);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    testing::Message::~Message((Message *)0x123410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123485);
  pAVar4 = (AssertionResult *)&stack0xffffffffffffff58;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             SUB81((ulong)pAVar4 >> 0x38,0));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x12356c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1235d8);
  return;
}

Assistant:

TEST(CoreTest, ConvertToInt) {
  EXPECT_FALSE((fmt::convert_to_int<char, char>::value));
  EXPECT_FALSE((fmt::convert_to_int<const char *, char>::value));
  EXPECT_TRUE((fmt::convert_to_int<basic_enum, char>::value));
}